

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpscValueQueue.h
# Opt level: O2

ssize_t __thiscall
teetime::SpscValueQueue<teetime::File>::write
          (SpscValueQueue<teetime::File> *this,int __fd,void *__buf,size_t __n)

{
  __atomic_base<bool> _Var1;
  size_t sVar2;
  size_t sVar3;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  Entry *pEVar4;
  
  sVar2 = this->m_writeIndex;
  pEVar4 = (this->m_array)._M_t.
           super___uniq_ptr_impl<teetime::SpscValueQueue<teetime::File>::Entry,_std::default_delete<teetime::SpscValueQueue<teetime::File>::Entry[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_teetime::SpscValueQueue<teetime::File>::Entry_*,_std::default_delete<teetime::SpscValueQueue<teetime::File>::Entry[]>_>
           .super__Head_base<0UL,_teetime::SpscValueQueue<teetime::File>::Entry_*,_false>.
           _M_head_impl;
  _Var1._M_i = pEVar4[sVar2].hasValue._M_base._M_i;
  if ((_Var1._M_i & 1U) == 0) {
    pEVar4 = pEVar4 + sVar2;
    std::__cxx11::string::string((string *)pEVar4,(string *)CONCAT44(in_register_00000034,__fd));
    (pEVar4->hasValue)._M_base._M_i = true;
    sVar3 = 0;
    if (sVar2 + 1 != this->m_capacity) {
      sVar3 = sVar2 + 1;
    }
    this->m_writeIndex = sVar3;
  }
  return CONCAT71((int7)((ulong)unaff_RBX >> 8),~_Var1._M_i) & 0xffffff01;
}

Assistant:

bool write(T&& t)
  {
    const auto index = m_writeIndex;
    auto& entry = m_array[index];

    if (!entry.hasValue.load(std::memory_order_acquire))
    {
      internal::constructAt<T>(std::move(t), entry.ptr());
      entry.hasValue.store(true, std::memory_order_release);
      const auto next = index + 1;
      m_writeIndex = (next != m_capacity) ? next : 0;
      return true;
    }

    return false;
  }